

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::CoordSysTransform(BasicSceneBuilder *this,string *origName,FileLoc loc)

{
  bool bVar1;
  mapped_type *__src;
  string *in_RSI;
  string *in_RDI;
  string name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
  *in_stack_ffffffffffffff68;
  _Self local_70;
  _Self local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  key_type *in_stack_ffffffffffffffa8;
  FileLoc *in_stack_ffffffffffffffb0;
  string local_30 [40];
  string *str;
  
  str = in_RDI;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  NormalizeUTF8(str);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x525329);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator!=(&local_68,&local_70);
  if (bVar1) {
    __src = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
                          *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    memcpy(in_RDI + 0x19,__src,0x100);
  }
  else {
    Warning<std::__cxx11::string&>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void BasicSceneBuilder::CoordSysTransform(const std::string &origName, FileLoc loc) {
    std::string name = NormalizeUTF8(origName);
    if (namedCoordinateSystems.find(name) != namedCoordinateSystems.end())
        graphicsState.ctm = namedCoordinateSystems[name];
    else
        Warning(&loc, "Couldn't find named coordinate system \"%s\"", name);
}